

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
::soo_slot(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *this)

{
  size_t sVar1;
  
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 == 1) {
    return (slot_type *)
           &(this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_;
  }
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                 );
  }
  __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x101f,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
               );
}

Assistant:

slot_type* soo_slot() {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return static_cast<slot_type*>(common().soo_data());
  }